

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__decode_uint8_srgb_AR(float *decodep,int width_times_channels,void *inputp)

{
  float *pfVar1;
  byte *pbVar2;
  float *decode;
  float *pfVar3;
  float *pfVar4;
  
  pfVar1 = decodep + width_times_channels;
  pfVar3 = decodep;
  if (3 < width_times_channels) {
    do {
      *pfVar3 = stbir__srgb_uchar_to_linear_float[*(byte *)((long)inputp + 1)];
      pfVar3[1] = stbir__srgb_uchar_to_linear_float[*inputp];
      pfVar3[2] = stbir__srgb_uchar_to_linear_float[*(byte *)((long)inputp + 3)];
      pfVar3[3] = stbir__srgb_uchar_to_linear_float[*(byte *)((long)inputp + 2)];
      inputp = (void *)((long)inputp + 4);
      decodep = pfVar3 + 4;
      pfVar4 = pfVar3 + 8;
      pfVar3 = decodep;
    } while (pfVar4 <= pfVar1);
  }
  if (decodep < pfVar1) {
    pbVar2 = (byte *)((long)inputp + 1);
    do {
      *decodep = stbir__srgb_uchar_to_linear_float[*pbVar2];
      decodep[1] = stbir__srgb_uchar_to_linear_float[pbVar2[-1]];
      decodep = decodep + 2;
      pbVar2 = pbVar2 + 2;
    } while (decodep < pfVar1);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME(stbir__decode_uint8_srgb)( float * decodep, int width_times_channels, void const * inputp )
{
  float STBIR_STREAMOUT_PTR( * ) decode = decodep;
  float const * decode_end = (float*) decode + width_times_channels;
  unsigned char const * input = (unsigned char const *)inputp;

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  decode += 4;
  while( decode <= decode_end )
  {
    decode[0-4] = stbir__srgb_uchar_to_linear_float[ input[ stbir__decode_order0 ] ];
    decode[1-4] = stbir__srgb_uchar_to_linear_float[ input[ stbir__decode_order1 ] ];
    decode[2-4] = stbir__srgb_uchar_to_linear_float[ input[ stbir__decode_order2 ] ];
    decode[3-4] = stbir__srgb_uchar_to_linear_float[ input[ stbir__decode_order3 ] ];
    decode += 4;
    input += 4;
  }
  decode -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( decode < decode_end )
  {
    STBIR_NO_UNROLL(decode);
    decode[0] = stbir__srgb_uchar_to_linear_float[ input[ stbir__decode_order0 ] ];
    #if stbir__coder_min_num >= 2
    decode[1] = stbir__srgb_uchar_to_linear_float[ input[ stbir__decode_order1 ] ];
    #endif
    #if stbir__coder_min_num >= 3
    decode[2] = stbir__srgb_uchar_to_linear_float[ input[ stbir__decode_order2 ] ];
    #endif
    decode += stbir__coder_min_num;
    input += stbir__coder_min_num;
  }
  #endif
}